

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int64_t __thiscall
aeron::archive::AeronArchive::getRecordingPosition(AeronArchive *this,int64_t recordingId)

{
  int64_t iVar1;
  anon_class_16_2_7d676519 local_48;
  function<bool_(long)> local_38;
  int64_t local_18;
  int64_t recordingId_local;
  AeronArchive *this_local;
  
  local_48.recordingId = &local_18;
  local_48.this = this;
  local_18 = recordingId;
  recordingId_local = (int64_t)this;
  std::function<bool(long)>::
  function<aeron::archive::AeronArchive::getRecordingPosition(long)::__0,void>
            ((function<bool(long)> *)&local_38,&local_48);
  iVar1 = callAndPollForResponse(this,&local_38,"get recording position");
  std::function<bool_(long)>::~function(&local_38);
  return iVar1;
}

Assistant:

std::int64_t AeronArchive::getRecordingPosition(std::int64_t recordingId) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->getRecordingPosition(recordingId, correlationId, controlSessionId_);
        },
        "get recording position");
}